

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O0

void gen_logic_CC(TCGContext_conflict1 *tcg_ctx,int sf,TCGv_i64 result)

{
  TCGv_i64 result_local;
  int sf_local;
  TCGContext_conflict1 *tcg_ctx_local;
  
  if (sf == 0) {
    tcg_gen_extrl_i64_i32_aarch64(tcg_ctx,tcg_ctx->cpu_ZF,result);
    tcg_gen_mov_i32(tcg_ctx,tcg_ctx->cpu_NF,tcg_ctx->cpu_ZF);
  }
  else {
    gen_set_NZ64(tcg_ctx,result);
  }
  tcg_gen_movi_i32(tcg_ctx,tcg_ctx->cpu_CF,0);
  tcg_gen_movi_i32(tcg_ctx,tcg_ctx->cpu_VF,0);
  return;
}

Assistant:

static inline void gen_logic_CC(TCGContext *tcg_ctx, int sf, TCGv_i64 result)
{
    if (sf) {
        gen_set_NZ64(tcg_ctx, result);
    } else {
        tcg_gen_extrl_i64_i32(tcg_ctx, tcg_ctx->cpu_ZF, result);
        tcg_gen_mov_i32(tcg_ctx, tcg_ctx->cpu_NF, tcg_ctx->cpu_ZF);
    }
    tcg_gen_movi_i32(tcg_ctx, tcg_ctx->cpu_CF, 0);
    tcg_gen_movi_i32(tcg_ctx, tcg_ctx->cpu_VF, 0);
}